

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3_result_text64
               (sqlite3_context *pCtx,char *z,sqlite3_uint64 n,_func_void_void_ptr *xDel,uchar enc)

{
  void *in_RCX;
  _func_void_void_ptr *in_RDX;
  undefined8 in_RSI;
  char *in_RDI;
  char in_R8B;
  undefined7 unaff_retaddr;
  undefined7 in_stack_ffffffffffffffd8;
  
  if (in_R8B != '\x01') {
    if (in_R8B == '\x04') {
      in_R8B = '\x02';
    }
    in_RDX = (_func_void_void_ptr *)((ulong)in_RDX & 0xfffffffffffffffe);
  }
  if (in_RDX < (_func_void_void_ptr *)0x80000000) {
    setResultStrOrError((sqlite3_context *)CONCAT17(enc,unaff_retaddr),in_RDI,
                        (int)((ulong)in_RSI >> 0x20),(u8)((ulong)in_RSI >> 0x18),in_RDX);
    sqlite3VdbeMemZeroTerminateIfAble((Mem *)0x13f00a);
  }
  else {
    invokeValueDestructor
              (in_RCX,(_func_void_void_ptr *)CONCAT17(in_R8B,in_stack_ffffffffffffffd8),
               (sqlite3_context *)0x13efd9);
  }
  return;
}

Assistant:

SQLITE_API void sqlite3_result_text64(
  sqlite3_context *pCtx,
  const char *z,
  sqlite3_uint64 n,
  void (*xDel)(void *),
  unsigned char enc
){
#ifdef SQLITE_ENABLE_API_ARMOR
  if( pCtx==0 ){
    invokeValueDestructor(z, xDel, 0);
    return;
  }
#endif
  assert( sqlite3_mutex_held(pCtx->pOut->db->mutex) );
  assert( xDel!=SQLITE_DYNAMIC );
  if( enc!=SQLITE_UTF8 ){
    if( enc==SQLITE_UTF16 ) enc = SQLITE_UTF16NATIVE;
    n &= ~(u64)1;
  }
  if( n>0x7fffffff ){
    (void)invokeValueDestructor(z, xDel, pCtx);
  }else{
    setResultStrOrError(pCtx, z, (int)n, enc, xDel);
    sqlite3VdbeMemZeroTerminateIfAble(pCtx->pOut);
  }
}